

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O3

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> * __thiscall
cfd::CoinSelection::KnapsackSolver
          (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__return_storage_ptr__,CoinSelection *this
          ,int64_t *target_value,vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *utxos,
          uint64_t min_change,int64_t *select_value,Amount *utxo_fee_value)

{
  Utxo *pUVar1;
  long lVar2;
  iterator iVar3;
  Utxo *pUVar4;
  unkbyte9 Var5;
  pointer ppUVar6;
  uint64_t *puVar7;
  CoinSelection *this_00;
  CfdException *this_01;
  unsigned_long uVar8;
  pointer ppUVar9;
  uint uVar10;
  long n_total_value;
  uint64_t uVar11;
  pointer puVar12;
  pointer puVar13;
  Utxo **utxo;
  pointer ppUVar14;
  __normal_iterator<const_cfd::Utxo_**,_std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>_>
  __i;
  ulong uVar15;
  long lVar16;
  Utxo **ppUVar17;
  int64_t satoshi_amount;
  Utxo **ppUVar18;
  Utxo *pUVar19;
  Amount AVar20;
  int64_t n_target;
  vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> applicable_groups;
  int64_t n_best;
  vector<char,_std::allocator<char>_> vf_best;
  int64_t n_effective_total;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  vector<char,_std::allocator<char>_> vf_best2;
  int64_t n_best2;
  uint64_t local_d8;
  unsigned_long local_d0;
  vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> local_c8;
  uint64_t *local_b0;
  CoinSelection *local_a8;
  unsigned_long local_a0;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  unsigned_long local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  undefined1 local_58 [16];
  char *local_48;
  unsigned_long local_38;
  
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0 = *target_value;
  local_98._0_8_ = "cfd_utxo.cpp";
  local_98._8_4_ = 0x2f8;
  local_88._M_allocated_capacity = 0x61be23;
  local_a8 = this;
  core::logger::log<long&>
            ((CfdSourceLocation *)local_98,kCfdLogLevelInfo,"KnapsackSolver start. target={}",
             (long *)&local_d0);
  local_c8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Utxo **)0x0;
  local_c8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl.
  super__Vector_impl_data._M_start = (Utxo **)0x0;
  local_c8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (Utxo **)0x0;
  local_78 = 0;
  core::RandomNumberUtil::GetRandomIndexes
            (&local_70,
             (uint32_t)
             ((ulong)((long)(utxos->super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(utxos->super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>).
                           _M_impl.super__Vector_impl_data._M_start) >> 3));
  local_b0 = (uint64_t *)select_value;
  if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar8 = 0;
    n_total_value = 0;
    pUVar19 = (Utxo *)0x0;
  }
  else {
    ppUVar9 = (utxos->super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar8 = 0;
    pUVar19 = (Utxo *)0x0;
    n_total_value = 0;
    uVar15 = 0;
    puVar12 = local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar13 = local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      pUVar1 = ppUVar9[uVar15];
      if (pUVar1->effective_k_value == local_d0) {
        iVar3._M_current =
             (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<cfd::Utxo,std::allocator<cfd::Utxo>>::_M_realloc_insert<cfd::Utxo_const&>
                    ((vector<cfd::Utxo,std::allocator<cfd::Utxo>> *)__return_storage_ptr__,iVar3,
                     pUVar1);
        }
        else {
          memcpy(iVar3._M_current,pUVar1,0xd8);
          (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        pUVar19 = (utxos->super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar15];
        *local_b0 = pUVar19->amount;
        AVar20 = core::Amount::CreateBySatoshiAmount(pUVar19->fee);
        utxo_fee_value->amount_ = AVar20.amount_;
        utxo_fee_value->ignore_check_ = AVar20.ignore_check_;
        local_98._0_8_ = "cfd_utxo.cpp";
        local_98._8_4_ = 0x30c;
        local_88._M_allocated_capacity = 0x61be23;
        local_58._0_8_ =
             ((long)(__return_storage_ptr__->
                    super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(__return_storage_ptr__->
                    super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
        core::logger::log<unsigned_long&>
                  ((CfdSourceLocation *)local_98,kCfdLogLevelInfo,"KnapsackSolver end. results={}",
                   (unsigned_long *)local_58);
        goto LAB_003dc57b;
      }
      if (pUVar1->effective_k_value < (long)(local_d0 + min_change)) {
        if (local_c8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_c8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<cfd::Utxo_const*,std::allocator<cfd::Utxo_const*>>::
          _M_realloc_insert<cfd::Utxo_const*const&>
                    ((vector<cfd::Utxo_const*,std::allocator<cfd::Utxo_const*>> *)&local_c8,
                     (iterator)
                     local_c8.
                     super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,ppUVar9 + uVar15);
        }
        else {
          *local_c8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
           _M_impl.super__Vector_impl_data._M_finish = pUVar1;
          local_c8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl
          .super__Vector_impl_data._M_finish =
               local_c8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
          local_78 = uVar8;
        }
        ppUVar9 = (utxos->super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar2 = ppUVar9[uVar15]->effective_k_value;
        lVar16 = 0;
        if (0 < lVar2) {
          lVar16 = lVar2;
        }
        n_total_value = n_total_value + lVar16;
        uVar8 = local_78 + lVar2;
        puVar12 = local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar13 = local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        local_78 = uVar8;
      }
      else if ((pUVar19 == (Utxo *)0x0) || (pUVar1->amount < pUVar19->amount)) {
        pUVar19 = pUVar1;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (ulong)((long)puVar13 - (long)puVar12 >> 2));
  }
  puVar7 = local_b0;
  ppUVar6 = local_c8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppUVar14 = local_c8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (uVar8 == local_d0) {
    if (local_c8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_c8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar11 = 0;
      satoshi_amount = 0;
    }
    else {
      satoshi_amount = 0;
      uVar11 = 0;
      do {
        iVar3._M_current =
             (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<cfd::Utxo,std::allocator<cfd::Utxo>>::_M_realloc_insert<cfd::Utxo_const&>
                    ((vector<cfd::Utxo,std::allocator<cfd::Utxo>> *)__return_storage_ptr__,iVar3,
                     *ppUVar14);
        }
        else {
          memcpy(iVar3._M_current,*ppUVar14,0xd8);
          (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        uVar11 = uVar11 + (*ppUVar14)->amount;
        satoshi_amount = satoshi_amount + (*ppUVar14)->fee;
        ppUVar14 = ppUVar14 + 1;
      } while (ppUVar14 != ppUVar6);
    }
    *local_b0 = uVar11;
    AVar20 = core::Amount::CreateBySatoshiAmount(satoshi_amount);
    utxo_fee_value->amount_ = AVar20.amount_;
    utxo_fee_value->ignore_check_ = AVar20.ignore_check_;
    local_98._0_8_ = "cfd_utxo.cpp";
    local_98._8_4_ = 0x32a;
    local_88._M_allocated_capacity = 0x61be23;
    local_58._0_8_ =
         ((long)(__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    core::logger::log<unsigned_long&>
              ((CfdSourceLocation *)local_98,kCfdLogLevelInfo,"KnapsackSolver end. results={}",
               (unsigned_long *)local_58);
  }
  else if (n_total_value < (long)local_d0) {
    if (pUVar19 == (Utxo *)0x0) {
      local_98._0_8_ = "cfd_utxo.cpp";
      local_98._8_4_ = 0x332;
      local_88._M_allocated_capacity = 0x61be23;
      core::logger::log<long&,long&>
                ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,
                 "insufficient funds. effective_total:{} target:{}",(long *)&local_78,
                 (long *)&local_d0);
      this_01 = (CfdException *)__cxa_allocate_exception(0x30);
      local_98._0_8_ = &local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"insufficient funds.","");
      core::CfdException::CfdException(this_01,kCfdIllegalStateError,(string *)local_98);
      __cxa_throw(this_01,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    iVar3._M_current =
         (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl
         .super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<cfd::Utxo,std::allocator<cfd::Utxo>>::_M_realloc_insert<cfd::Utxo_const&>
                ((vector<cfd::Utxo,std::allocator<cfd::Utxo>> *)__return_storage_ptr__,iVar3,pUVar19
                );
    }
    else {
      memcpy(iVar3._M_current,pUVar19,0xd8);
      (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    *puVar7 = pUVar19->amount;
    AVar20 = core::Amount::CreateBySatoshiAmount(pUVar19->fee);
    utxo_fee_value->amount_ = AVar20.amount_;
    utxo_fee_value->ignore_check_ = AVar20.ignore_check_;
    local_98._0_8_ = "cfd_utxo.cpp";
    local_98._8_4_ = 0x33b;
    local_88._M_allocated_capacity = 0x61be23;
    local_58._0_8_ =
         ((long)(__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    core::logger::log<unsigned_long&>
              ((CfdSourceLocation *)local_98,kCfdLogLevelInfo,"KnapsackSolver end. results={}",
               (unsigned_long *)local_58);
  }
  else {
    if (local_c8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_c8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar16 = (long)local_c8.
                     super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_c8.
                     super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      uVar15 = lVar16 >> 3;
      lVar2 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<cfd::Utxo_const**,std::vector<cfd::Utxo_const*,std::allocator<cfd::Utxo_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cfd::CoinSelection::KnapsackSolver(long_const&,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>const&,unsigned_long,long*,cfd::core::Amount*)::__0>>
                (local_c8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_c8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar16 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cfd::Utxo_const**,std::vector<cfd::Utxo_const*,std::allocator<cfd::Utxo_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cfd::CoinSelection::KnapsackSolver(long_const&,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>const&,unsigned_long,long*,cfd::core::Amount*)::__0>>
                  (ppUVar14,ppUVar6);
      }
      else {
        ppUVar17 = ppUVar14 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cfd::Utxo_const**,std::vector<cfd::Utxo_const*,std::allocator<cfd::Utxo_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cfd::CoinSelection::KnapsackSolver(long_const&,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>const&,unsigned_long,long*,cfd::core::Amount*)::__0>>
                  (ppUVar14,ppUVar17);
        for (; ppUVar17 != ppUVar6; ppUVar17 = ppUVar17 + 1) {
          pUVar1 = ppUVar17[-1];
          pUVar4 = *ppUVar17;
          lVar2 = pUVar4->effective_k_value;
          lVar16 = pUVar1->effective_k_value;
          ppUVar18 = ppUVar17;
          while (lVar16 < lVar2) {
            *ppUVar18 = pUVar1;
            pUVar1 = ppUVar18[-2];
            ppUVar18 = ppUVar18 + -1;
            lVar16 = pUVar1->effective_k_value;
          }
          *ppUVar18 = pUVar4;
        }
      }
    }
    this_00 = local_a8;
    local_98._0_8_ = (char *)0x0;
    local_98._8_8_ = (pointer)0x0;
    local_88._M_allocated_capacity = 0;
    (local_a8->randomize_cache_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
         (local_a8->randomize_cache_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    (local_a8->randomize_cache_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    ApproximateBestSubset
              (local_a8,&local_c8,n_total_value,local_d0,
               (vector<char,_std::allocator<char>_> *)local_98,(int64_t *)&local_a0,100000);
    if ((local_a0 != local_d0) && ((long)(local_d0 + min_change) <= n_total_value)) {
      local_38 = local_a0;
      local_58._0_8_ = (pointer)0x0;
      local_58._8_8_ = (pointer)0x0;
      local_48 = (char *)0x0;
      ApproximateBestSubset
                (this_00,&local_c8,n_total_value,local_d0 + min_change,
                 (vector<char,_std::allocator<char>_> *)local_58,(int64_t *)&local_38,100000);
      if ((local_38 == local_d0) || ((long)local_38 < (long)local_a0)) {
        local_a0 = local_38;
        std::vector<char,_std::allocator<char>_>::operator=
                  ((vector<char,_std::allocator<char>_> *)local_98,
                   (vector<char,_std::allocator<char>_> *)local_58);
      }
      if ((pointer)local_58._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_58._0_8_,(long)local_48 - local_58._0_8_);
      }
    }
    if ((pUVar19 == (Utxo *)0x0) ||
       ((local_a0 == local_d0 || (long)(min_change + local_d0) <= (long)local_a0 &&
        ((long)local_a0 < pUVar19->effective_k_value)))) {
      if (local_c8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl
          .super__Vector_impl_data._M_finish ==
          local_c8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl
          .super__Vector_impl_data._M_start) {
        local_a8 = (CoinSelection *)0x0;
        local_d8 = 0;
      }
      else {
        uVar10 = 1;
        uVar15 = 0;
        local_d8 = 0;
        local_a8 = (CoinSelection *)0x0;
        ppUVar17 = local_c8.
                   super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
        ppUVar18 = local_c8.
                   super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl
                   .super__Vector_impl_data._M_finish;
        do {
          if (*(char *)(local_98._0_8_ + uVar15) != '\0') {
            iVar3._M_current =
                 (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<cfd::Utxo,std::allocator<cfd::Utxo>>::_M_realloc_insert<cfd::Utxo_const&>
                        ((vector<cfd::Utxo,std::allocator<cfd::Utxo>> *)__return_storage_ptr__,iVar3
                         ,ppUVar17[uVar15]);
              ppUVar17 = local_c8.
                         super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              ppUVar18 = local_c8.
                         super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              memcpy(iVar3._M_current,ppUVar17[uVar15],0xd8);
              (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
              _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
            local_d8 = local_d8 + ppUVar17[uVar15]->amount;
            local_a8 = (CoinSelection *)(&local_a8->use_bnb_ + ppUVar17[uVar15]->fee);
          }
          uVar15 = (ulong)uVar10;
          uVar10 = uVar10 + 1;
        } while (uVar15 < (ulong)((long)ppUVar18 - (long)ppUVar17 >> 3));
      }
      *local_b0 = local_d8;
      AVar20 = core::Amount::CreateBySatoshiAmount((int64_t)local_a8);
      Var5 = AVar20._0_9_;
    }
    else {
      iVar3._M_current =
           (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<cfd::Utxo,std::allocator<cfd::Utxo>>::_M_realloc_insert<cfd::Utxo_const&>
                  ((vector<cfd::Utxo,std::allocator<cfd::Utxo>> *)__return_storage_ptr__,iVar3,
                   pUVar19);
      }
      else {
        memcpy(iVar3._M_current,pUVar19,0xd8);
        (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      *local_b0 = pUVar19->amount;
      AVar20 = core::Amount::CreateBySatoshiAmount(pUVar19->fee);
      Var5 = AVar20._0_9_;
    }
    utxo_fee_value->amount_ = (int64_t)Var5;
    utxo_fee_value->ignore_check_ = SUB91((unkuint9)Var5 >> 0x40,0);
    local_58._0_8_ = "cfd_utxo.cpp";
    local_58._8_4_ = 0x36d;
    local_48 = "KnapsackSolver";
    local_38 = ((long)(__return_storage_ptr__->
                      super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(__return_storage_ptr__->
                      super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    core::logger::log<unsigned_long&>
              ((CfdSourceLocation *)local_58,kCfdLogLevelInfo,"KnapsackSolver end. results={}",
               &local_38);
    if ((char *)local_98._0_8_ != (char *)0x0) {
      operator_delete((void *)local_98._0_8_,local_88._M_allocated_capacity - local_98._0_8_);
    }
  }
LAB_003dc57b:
  if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl.
      super__Vector_impl_data._M_start != (Utxo **)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Utxo> CoinSelection::KnapsackSolver(
    const int64_t& target_value, const std::vector<Utxo*>& utxos,
    uint64_t min_change, int64_t* select_value, Amount* utxo_fee_value) {
  std::vector<Utxo> ret_utxos;
  int64_t n_target = target_value;
  int64_t n_min_change = static_cast<int64_t>(min_change);
  info(CFD_LOG_SOURCE, "KnapsackSolver start. target={}", n_target);

  // List of values less than target
  const Utxo* lowest_larger = nullptr;
  std::vector<const Utxo*> applicable_groups;
  // int64_t n_total = 0;
  int64_t n_effective_total = 0;  // amount excluding fee
  int64_t n_effective_total_max = 0;
  int64_t utxo_fee = 0;

  std::vector<uint32_t> indexes =
      RandomNumberUtil::GetRandomIndexes(static_cast<uint32_t>(utxos.size()));

  for (size_t index = 0; index < indexes.size(); ++index) {
    // if (utxos[index]->amount == n_target) {
    if (utxos[index]->effective_k_value == n_target) {
      // that meets the required value
      ret_utxos.push_back(*utxos[index]);
      *select_value = utxos[index]->amount;
      *utxo_fee_value = Amount::CreateBySatoshiAmount(utxos[index]->fee);
      info(CFD_LOG_SOURCE, "KnapsackSolver end. results={}", ret_utxos.size());
      return ret_utxos;

    } else if (utxos[index]->effective_k_value < n_target + n_min_change) {
      // } else if ((utxos[index]->amount < n_target + min_change) {
      applicable_groups.push_back(utxos[index]);
      // n_total += utxos[index]->amount;
      if (utxos[index]->effective_k_value > 0) {
        n_effective_total_max += utxos[index]->effective_k_value;
      }
      n_effective_total += utxos[index]->effective_k_value;

    } else if (
        lowest_larger == nullptr ||
        utxos[index]->amount < lowest_larger->amount) {
      // greater than `n_target + min_change`
      lowest_larger = utxos[index];
    }
  }

  // if (n_total == n_target) {
  if (n_effective_total == n_target) {
    uint64_t ret_value = 0;
    for (const auto& utxo : applicable_groups) {
      ret_utxos.push_back(*utxo);
      ret_value += utxo->amount;
      utxo_fee += utxo->fee;
    }
    *select_value = static_cast<int64_t>(ret_value);
    *utxo_fee_value = Amount::CreateBySatoshiAmount(utxo_fee);
    info(CFD_LOG_SOURCE, "KnapsackSolver end. results={}", ret_utxos.size());
    return ret_utxos;
  }

  // if (n_total < n_target) {
  if (n_effective_total_max < n_target) {
    if (lowest_larger == nullptr) {
      warn(
          CFD_LOG_SOURCE, "insufficient funds. effective_total:{} target:{}",
          n_effective_total, n_target);
      throw CfdException(
          CfdError::kCfdIllegalStateError, "insufficient funds.");
    }

    ret_utxos.push_back(*lowest_larger);
    *select_value = static_cast<int64_t>(lowest_larger->amount);
    *utxo_fee_value = Amount::CreateBySatoshiAmount(lowest_larger->fee);
    info(CFD_LOG_SOURCE, "KnapsackSolver end. results={}", ret_utxos.size());
    return ret_utxos;
  }

  std::sort(
      applicable_groups.begin(), applicable_groups.end(),
      [](const Utxo* a, const Utxo* b) {
        return a->effective_k_value > b->effective_k_value;
      });
  std::vector<char> vf_best;
  int64_t n_best;

  randomize_cache_.clear();
  ApproximateBestSubset(
      applicable_groups, n_effective_total_max, n_target, &vf_best, &n_best,
      kApproximateBestSubsetIterations);
  if (n_best != n_target && n_effective_total_max >= n_target + n_min_change) {
    int64_t n_best2 = n_best;
    std::vector<char> vf_best2;
    ApproximateBestSubset(
        applicable_groups, n_effective_total_max, (n_target + n_min_change),
        &vf_best2, &n_best2, kApproximateBestSubsetIterations);
    if ((n_best2 == n_target) || (n_best > n_best2)) {
      n_best = n_best2;
      vf_best = vf_best2;
    }
  }

  // NOLINT If we have a bigger coin and (either the stochastic approximation didn't find a good solution,
  // NOLINT                                or the next bigger coin is closer), return the bigger coin
  if (lowest_larger != nullptr &&
      ((n_best != n_target && n_best < n_target + n_min_change) ||
       lowest_larger->effective_k_value <= n_best)) {
    // lowest_larger->amount <= n_best)) {
    ret_utxos.push_back(*lowest_larger);
    *select_value = static_cast<int64_t>(lowest_larger->amount);
    *utxo_fee_value = Amount::CreateBySatoshiAmount(lowest_larger->fee);

  } else {
    uint64_t ret_value = 0;
    for (unsigned int i = 0; i < applicable_groups.size(); i++) {
      if (vf_best[i]) {
        ret_utxos.push_back(*applicable_groups[i]);
        ret_value += applicable_groups[i]->amount;
        utxo_fee += applicable_groups[i]->fee;
      }
    }
    *select_value = static_cast<int64_t>(ret_value);
    *utxo_fee_value = Amount::CreateBySatoshiAmount(utxo_fee);
  }
  info(CFD_LOG_SOURCE, "KnapsackSolver end. results={}", ret_utxos.size());
  return ret_utxos;
}